

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side3_2d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  
  dVar21 = *p0;
  dVar34 = p0[1];
  dVar24 = *p1 - dVar21;
  dVar29 = p1[1] - dVar34;
  dVar26 = *p2 - dVar21;
  dVar30 = p2[1] - dVar34;
  dVar8 = *q0 - dVar21;
  dVar14 = q0[1] - dVar34;
  dVar32 = *q1 - dVar21;
  dVar16 = q1[1] - dVar34;
  dVar18 = *q2 - dVar21;
  dVar33 = q2[1] - dVar34;
  dVar31 = ABS(dVar30);
  if (ABS(dVar30) <= ABS(dVar26)) {
    dVar31 = ABS(dVar26);
  }
  dVar9 = ABS(dVar14);
  if (ABS(dVar14) <= ABS(dVar8)) {
    dVar9 = ABS(dVar8);
  }
  dVar4 = ABS(dVar32);
  if (ABS(dVar32) <= dVar9) {
    dVar4 = dVar9;
  }
  dVar9 = ABS(dVar16);
  if (ABS(dVar16) <= dVar4) {
    dVar9 = dVar4;
  }
  dVar4 = ABS(dVar18);
  if (ABS(dVar18) <= dVar9) {
    dVar4 = dVar9;
  }
  dVar9 = ABS(dVar33);
  if (ABS(dVar33) <= dVar4) {
    dVar9 = dVar4;
  }
  dVar4 = ABS(dVar29);
  if (ABS(dVar29) <= ABS(dVar24)) {
    dVar4 = ABS(dVar24);
  }
  dVar10 = dVar31;
  dVar11 = dVar9;
  if ((dVar9 <= dVar31) && (dVar10 = dVar9, dVar9 < dVar31)) {
    dVar11 = dVar31;
  }
  dVar12 = dVar4;
  if ((dVar10 <= dVar4) && (dVar12 = dVar10, dVar11 < dVar4)) {
    dVar11 = dVar4;
  }
  iVar1 = 0;
  iVar3 = 0;
  if ((2.7953252803394562e-74 <= dVar12) && (iVar3 = iVar1, dVar11 <= 2.596148429267413e+33)) {
    dVar11 = dVar24 * dVar8 + dVar29 * dVar14;
    dVar23 = dVar24 * dVar32 + dVar29 * dVar16;
    dVar25 = dVar24 * dVar18 + dVar29 * dVar33;
    dVar15 = dVar26 * dVar8 + dVar30 * dVar14;
    dVar10 = dVar26 * dVar32 + dVar30 * dVar16;
    dVar17 = dVar26 * dVar18 + dVar30 * dVar33;
    dVar11 = dVar11 + dVar11;
    dVar23 = dVar23 + dVar23;
    dVar25 = dVar25 + dVar25;
    dVar15 = dVar15 + dVar15;
    dVar10 = dVar10 + dVar10;
    dVar17 = dVar17 + dVar17;
    dVar27 = dVar23 * dVar17 - dVar10 * dVar25;
    dVar19 = dVar25 * dVar15 - dVar17 * dVar11;
    dVar12 = dVar11 * dVar10 - dVar15 * dVar23;
    dVar20 = dVar4 * dVar9 * dVar31 * dVar9 * 3.644307565376031e-14;
    dVar28 = dVar27 + dVar19 + dVar12;
    iVar1 = 1;
    if ((dVar20 < dVar28) || (iVar1 = -1, dVar28 < -dVar20)) {
      dVar21 = *p3 - dVar21;
      dVar34 = p3[1] - dVar34;
      dVar20 = dVar31;
      if (dVar31 <= dVar9) {
        dVar20 = dVar9;
      }
      dVar6 = dVar4;
      if (dVar4 <= dVar20) {
        dVar6 = dVar20;
      }
      dVar20 = ABS(dVar34);
      if (ABS(dVar34) <= dVar4) {
        dVar20 = dVar4;
      }
      if (dVar4 <= dVar9) {
        dVar4 = dVar9;
      }
      dVar7 = ABS(dVar21);
      if (ABS(dVar21) <= dVar20) {
        dVar7 = dVar20;
      }
      dVar20 = dVar7;
      if (dVar7 <= dVar4) {
        dVar20 = dVar4;
      }
      dVar5 = dVar20;
      if (dVar20 <= dVar6) {
        dVar5 = dVar6;
      }
      dVar6 = dVar4;
      if (dVar4 <= dVar5) {
        dVar6 = dVar5;
      }
      dVar5 = dVar7;
      if (dVar7 <= dVar6) {
        dVar5 = dVar6;
      }
      dVar6 = dVar31;
      if (dVar9 <= dVar31) {
        dVar6 = dVar9;
      }
      dVar13 = dVar9;
      dVar22 = dVar5;
      if ((dVar6 <= dVar5) && (dVar22 = dVar6, dVar9 < dVar5)) {
        dVar13 = dVar5;
      }
      if (dVar13 <= 2.596148429267413e+33) {
        dVar6 = dVar20;
        if (dVar22 <= dVar20) {
          dVar6 = dVar22;
        }
        dVar13 = dVar4;
        if (dVar6 <= dVar4) {
          dVar13 = dVar6;
        }
        dVar6 = dVar7;
        if (dVar13 <= dVar7) {
          dVar6 = dVar13;
        }
        if (6.0198672948616725e-50 <= dVar6) {
          dVar24 = dVar24 * dVar24 + dVar29 * dVar29;
          dVar26 = dVar26 * dVar26 + dVar30 * dVar30;
          dVar14 = dVar8 * dVar21 + dVar14 * dVar34;
          dVar16 = dVar32 * dVar21 + dVar16 * dVar34;
          dVar8 = dVar18 * dVar21 + dVar33 * dVar34;
          dVar31 = dVar31 * dVar7 * dVar9 * dVar4 * dVar20 * dVar5 * 4.675444716138007e-13;
          dVar21 = dVar28 * (dVar21 * dVar21 + dVar34 * dVar34) -
                   ((dVar12 + (dVar15 - dVar10) * dVar24 + (dVar23 - dVar11) * dVar26) *
                    (dVar8 + dVar8) +
                   (dVar19 + (dVar17 - dVar15) * dVar24 + (dVar11 - dVar25) * dVar26) *
                   (dVar16 + dVar16) +
                   (dVar27 + (dVar10 - dVar17) * dVar24 + (dVar25 - dVar23) * dVar26) *
                   (dVar14 + dVar14));
          iVar2 = 1;
          if ((dVar31 < dVar21) || (iVar2 = -1, dVar21 < -dVar31)) {
            iVar3 = iVar2 * iVar1;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

inline int side3_2d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double l1;
    l1 = (1 * ((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double l2;
    l2 = (1 * ((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double l3;
    l3 = (1 * ((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double a10;
    a10 = (2 * ((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double a11;
    a11 = (2 * ((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double a12;
    a12 = (2 * ((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)));
    double a20;
    a20 = (2 * ((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)));
    double a21;
    a21 = (2 * ((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)));
    double a22;
    a22 = (2 * ((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)));
    double a30;
    a30 = (2 * ((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)));
    double a31;
    a31 = (2 * ((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)));
    double a32;
    a32 = (2 * ((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p2_0_p0_0);
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q2_0_p0_0)) )
    {
        max2 = fabs(q2_0_p0_0);
    } 
    if( (max2 < fabs(q2_1_p0_1)) )
    {
        max2 = fabs(q2_1_p0_1);
    } 
    double max3 = fabs(p1_0_p0_0);
    if( (max3 < fabs(p1_1_p0_1)) )
    {
        max3 = fabs(p1_1_p0_1);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 2.79532528033945620759e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (3.64430756537603111258e-14 * (((max3 * max2) * max1) * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max2;
    if( (max4 < max1) )
    {
        max4 = max1;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max2;
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max6 = max2;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    double max7 = max3;
    if( (max7 < fabs(p3_1_p0_1)) )
    {
        max7 = fabs(p3_1_p0_1);
    } 
    if( (max7 < fabs(p3_0_p0_0)) )
    {
        max7 = fabs(p3_0_p0_0);
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 6.01986729486167248087e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.67544471613800658534e-13 * (((((max7 * max2) * max1) * max6) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}